

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O2

cmArgumentParser<Arguments> * __thiscall
cmArgumentParser<cmExportCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
::Bind<std::__cxx11::string>
          (cmArgumentParser<cmExportCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
           *this,static_string_view name,
          offset_in_Arguments_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          member)

{
  pair<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>_>,_bool>
  pVar1;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(ArgumentParser::Instance_&,_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmArgumentParser.h:71:18)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(ArgumentParser::Instance_&,_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmArgumentParser.h:71:18)>
             ::_M_manager;
  local_30._M_unused._M_member_pointer = member;
  pVar1 = ArgumentParser::ActionMap::Emplace
                    ((ActionMap *)this,name.super_string_view,(Action *)&local_30);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return (cmArgumentParser<Arguments> *)this;
  }
  __assert_fail("inserted",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmArgumentParser.h"
                ,0x4b,
                "cmArgumentParser<Result> &cmArgumentParser<Arguments>::Bind(cm::static_string_view, T Result::*) [Result = Arguments, T = std::basic_string<char>]"
               );
}

Assistant:

cmArgumentParser& Bind(cm::static_string_view name, T Result::*member)
  {
    bool const inserted =
      this->Bindings
        .Emplace(name,
                 [member](ArgumentParser::Instance& instance, void* result) {
                   instance.Bind(static_cast<Result*>(result)->*member);
                 })
        .second;
    assert(inserted), (void)inserted;
    return *this;
  }